

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::renderBackground(SceneRender *this,Uniforms *_uniforms)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Tracker *pTVar4;
  Vbo *pVVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer this_00;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  allocator local_429;
  string local_428;
  mat<4,_4,_float,_(glm::qualifier)0> local_404;
  allocator local_3c1;
  string local_3c0;
  mat<4,_4,_float,_(glm::qualifier)0> local_39c;
  allocator local_359;
  string local_358;
  undefined1 local_334 [8];
  mat4 ori;
  unique_ptr<vera::Vbo,_std::default_delete<vera::Vbo>_> local_248;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  mat<4,_4,_float,_(glm::qualifier)0> local_1ec;
  allocator local_1a9;
  string local_1a8;
  mat<4,_4,_float,_(glm::qualifier)0> local_184;
  allocator local_141;
  string local_140;
  mat<4,_4,_float,_(glm::qualifier)0> local_11c;
  allocator local_d9;
  string local_d8;
  mat<4,_4,_float,_(glm::qualifier)0> local_b4;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Uniforms *local_18;
  Uniforms *_uniforms_local;
  SceneRender *this_local;
  
  local_18 = _uniforms;
  _uniforms_local = (Uniforms *)this;
  if ((this->m_background & 1U) == 0) {
    if ((((_uniforms->super_Scene).activeCubemap != (TextureCube *)0x0) &&
        ((this->showCubebox & 1U) != 0)) &&
       (uVar2 = (*(((_uniforms->super_Scene).activeCubemap)->super_Texture)._vptr_Texture[9])(),
       (uVar2 & 1) != 0)) {
      bVar1 = Tracker::isRunning(&local_18->tracker);
      if (bVar1) {
        pTVar4 = &local_18->tracker;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_238,"render:scene:cubemap",&local_239);
        Tracker::begin(pTVar4,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_239);
      }
      glDisable(0xb71);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_cubemap_vbo);
      if (!bVar1) {
        pVVar5 = (Vbo *)operator_new(0x60);
        ori.value[3].field_2._3_1_ = 1;
        vera::cubeMesh((Mesh *)&ori.value[3].field_3,1.0);
        vera::Vbo::Vbo(pVVar5,(Mesh *)&ori.value[3].field_3);
        ori.value[3].field_2._3_1_ = 0;
        std::unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>>::
        unique_ptr<std::default_delete<vera::Vbo>,void>
                  ((unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>> *)&local_248,pVVar5);
        std::unique_ptr<vera::Vbo,_std::default_delete<vera::Vbo>_>::operator=
                  (&this->m_cubemap_vbo,&local_248);
        std::unique_ptr<vera::Vbo,_std::default_delete<vera::Vbo>_>::~unique_ptr(&local_248);
        vera::Mesh::~Mesh((Mesh *)&ori.value[3].field_3);
      }
      (*(((local_18->super_Scene).activeCamera)->super_Node)._vptr_Node[0x1c])(local_334);
      vera::Shader::use(&this->m_cubemap_shader);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_358,"u_modelViewProjectionMatrix",&local_359);
      iVar3 = (*(((local_18->super_Scene).activeCamera)->super_Node)._vptr_Node[0x59])();
      glm::operator*(&local_39c,(mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var,iVar3),
                     (mat<4,_4,_float,_(glm::qualifier)0> *)local_334);
      vera::Shader::setUniform(&this->m_cubemap_shader,&local_358,&local_39c,false);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3c0,"u_modelMatrix",&local_3c1);
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_404,1.0);
      vera::Shader::setUniform(&this->m_cubemap_shader,&local_3c0,&local_404,false);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_428,"u_viewMatrix",&local_429);
      vera::Shader::setUniform(&this->m_cubemap_shader,&local_428,(mat4 *)local_334,false);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_450,"u_projectionMatrix",&local_451);
      iVar3 = (*(((local_18->super_Scene).activeCamera)->super_Node)._vptr_Node[0x59])();
      vera::Shader::setUniform
                (&this->m_cubemap_shader,&local_450,(mat4 *)CONCAT44(extraout_var_00,iVar3),false);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_478,"u_cubeMap",&local_479);
      vera::Shader::setUniformTextureCube
                (&this->m_cubemap_shader,&local_478,(local_18->super_Scene).activeCubemap,0);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
      this_00 = std::unique_ptr<vera::Vbo,_std::default_delete<vera::Vbo>_>::operator->
                          (&this->m_cubemap_vbo);
      vera::Vbo::render(this_00,&this->m_cubemap_shader);
      bVar1 = Tracker::isRunning(&local_18->tracker);
      if (bVar1) {
        pTVar4 = &local_18->tracker;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4a0,"render:scene:cubemap",&local_4a1);
        Tracker::end(pTVar4,&local_4a0);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      }
    }
  }
  else {
    bVar1 = Tracker::isRunning(&_uniforms->tracker);
    if (bVar1) {
      pTVar4 = &local_18->tracker;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,"render:scene:background",&local_39);
      Tracker::begin(pTVar4,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    glDisable(0xb71);
    vera::Shader::use(&this->m_background_shader);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"u_modelMatrix",&local_71);
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_b4,1.0);
    vera::Shader::setUniform(&this->m_background_shader,&local_70,&local_b4,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"u_viewMatrix",&local_d9);
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_11c,1.0);
    vera::Shader::setUniform(&this->m_background_shader,&local_d8,&local_11c,false);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"u_projectionMatrix",&local_141);
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_184,1.0);
    vera::Shader::setUniform(&this->m_background_shader,&local_140,&local_184,false);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"u_modelViewProjectionMatrix",&local_1a9);
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_1ec,1.0);
    vera::Shader::setUniform(&this->m_background_shader,&local_1a8,&local_1ec,false);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    (*(local_18->super_Scene)._vptr_Scene[0x3e])(local_18,&this->m_background_shader,1);
    pVVar5 = vera::getBillboard();
    vera::Vbo::render(pVVar5,&this->m_background_shader);
    bVar1 = Tracker::isRunning(&local_18->tracker);
    if (bVar1) {
      pTVar4 = &local_18->tracker;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"render:scene:background",&local_211);
      Tracker::end(pTVar4,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
  }
  return;
}

Assistant:

void SceneRender::renderBackground(Uniforms& _uniforms) {
    if (m_background) {
        TRACK_BEGIN("render:scene:background")
        glDisable(GL_DEPTH_TEST);

        m_background_shader.use();
        m_background_shader.setUniform("u_modelMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_viewMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_projectionMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_modelViewProjectionMatrix", glm::mat4(1.0));

        // Update Uniforms and textures
        _uniforms.feedTo( &m_background_shader );

        vera::getBillboard()->render( &m_background_shader );

        TRACK_END("render:scene:background")
    }

    else if (_uniforms.activeCubemap) {
        if (showCubebox && _uniforms.activeCubemap->loaded()) {
            TRACK_BEGIN("render:scene:cubemap")

            glDisable(GL_DEPTH_TEST);

            if (!m_cubemap_vbo)
                m_cubemap_vbo = std::unique_ptr<vera::Vbo>(new vera::Vbo( vera::cubeMesh(1.0f) ));

            glm::mat4 ori = _uniforms.activeCamera->getOrientationMatrix();

            #if defined(__EMSCRIPTEN__)
            if (vera::getXR() == vera::VR_MODE)
                ori = glm::inverse(ori);
            #endif

            m_cubemap_shader.use();
            m_cubemap_shader.setUniform("u_modelViewProjectionMatrix", _uniforms.activeCamera->getProjectionMatrix() * ori);
            m_cubemap_shader.setUniform("u_modelMatrix", glm::mat4(1.0));
            m_cubemap_shader.setUniform("u_viewMatrix", ori);
            m_cubemap_shader.setUniform("u_projectionMatrix", _uniforms.activeCamera->getProjectionMatrix());
            m_cubemap_shader.setUniformTextureCube("u_cubeMap", _uniforms.activeCubemap, 0);
            m_cubemap_vbo->render(&m_cubemap_shader);

            TRACK_END("render:scene:cubemap")
        }
    }
}